

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-close.c
# Opt level: O1

int run_test_poll_close(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  long lVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_poll_t poll_handles [64];
  undefined1 auStack_2018 [8192];
  
  lVar3 = 0;
  do {
    iVar1 = socket(2,1,0);
    uVar2 = uv_default_loop();
    uv_poll_init(uVar2,auStack_2018 + lVar3,iVar1);
    uv_poll_start(auStack_2018 + lVar3,3,0);
    lVar3 = lVar3 + 0x80;
  } while (lVar3 != 0x2000);
  lVar3 = 0;
  do {
    uv_close(auStack_2018 + lVar3,close_cb);
    lVar3 = lVar3 + 0x80;
  } while (lVar3 != 0x2000);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (close_cb_called == 0x40) {
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_poll_close_cold_1();
  }
  run_test_poll_close_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(poll_close) {
  uv_os_sock_t sockets[NUM_SOCKETS];
  uv_poll_t poll_handles[NUM_SOCKETS];
  int i;

#ifdef _WIN32
  {
    struct WSAData wsa_data;
    int r = WSAStartup(MAKEWORD(2, 2), &wsa_data);
    ASSERT_OK(r);
  }
#endif

  for (i = 0; i < NUM_SOCKETS; i++) {
    sockets[i] = socket(AF_INET, SOCK_STREAM, 0);
    uv_poll_init(uv_default_loop(), &poll_handles[i], sockets[i]);
    uv_poll_start(&poll_handles[i], UV_READABLE | UV_WRITABLE, NULL);
  }

  for (i = 0; i < NUM_SOCKETS; i++) {
    uv_close((uv_handle_t*) &poll_handles[i], close_cb);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(close_cb_called, NUM_SOCKETS);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}